

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::save_synth_exports(CVmImageLoader *this,CVmFile *fp)

{
  CVmFile *this_00;
  void *in_RSI;
  _func_void_void_ptr_CVmHashEntry_ptr *in_RDI;
  CVmHashTable *unaff_retaddr;
  long end_pos;
  long pos;
  synth_save_cb_ctx ctx;
  CVmFile *in_stack_ffffffffffffffd0;
  _func_void_void_ptr_CVmHashEntry_ptr *func;
  
  func = in_RDI;
  CVmFile::get_pos(in_stack_ffffffffffffffd0);
  CVmFile::write_uint4(in_stack_ffffffffffffffd0,(uint)((ulong)in_RDI >> 0x20));
  CVmHashTable::enum_entries(unaff_retaddr,func,in_RSI);
  this_00 = (CVmFile *)CVmFile::get_pos(in_stack_ffffffffffffffd0);
  CVmFile::set_pos(this_00,(long)in_RDI);
  CVmFile::write_uint4(this_00,(uint)((ulong)in_RDI >> 0x20));
  CVmFile::set_pos(this_00,(long)in_RDI);
  return;
}

Assistant:

void CVmImageLoader::save_synth_exports(VMG_ CVmFile *fp)
{
    synth_save_cb_ctx ctx;
    long pos;
    long end_pos;

    /* set up our context */
    ctx.fp = fp;
    ctx.cnt = 0;

    /* 
     *   write a placeholder count of zero, but remember where it is so we
     *   can come back and fix it up later 
     */
    pos = fp->get_pos();
    fp->write_uint4(0);

    /* enumerate all of the entries through our save callback */
    synth_exports_->enum_entries(&save_synth_export_cb, &ctx);

    /* go back and fix up the count, then seek back to the end */
    end_pos = fp->get_pos();
    fp->set_pos(pos);
    fp->write_uint4(ctx.cnt);
    fp->set_pos(end_pos);
}